

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap256.h
# Opt level: O0

int __thiscall re2::Bitmap256::FindNextSetBit(Bitmap256 *this,int c)

{
  int iVar1;
  ulong n;
  int iVar2;
  uint64_t word;
  int i;
  int c_local;
  Bitmap256 *this_local;
  
  if (c < 0) {
    __assert_fail("(c) >= (0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O0/_deps/re2-src/re2/bitmap256.h"
                  ,0x56,"int re2::Bitmap256::FindNextSetBit(int) const");
  }
  if (0xff < c) {
    __assert_fail("(c) <= (255)",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O0/_deps/re2-src/re2/bitmap256.h"
                  ,0x57,"int re2::Bitmap256::FindNextSetBit(int) const");
  }
  iVar2 = c / 0x40;
  n = this->words_[iVar2] & -1L << ((byte)((long)c % 0x40) & 0x3f);
  if (n != 0) {
    iVar1 = FindLSBSet(n);
    return iVar2 * 0x40 + iVar1;
  }
  if (iVar2 == 0) {
    if (this->words_[1] != 0) {
      iVar2 = FindLSBSet(this->words_[1]);
      return iVar2 + 0x40;
    }
  }
  else if (iVar2 != 1) {
    if (iVar2 != 2) {
      return -1;
    }
    goto LAB_0036f544;
  }
  if (this->words_[2] != 0) {
    iVar2 = FindLSBSet(this->words_[2]);
    return iVar2 + 0x80;
  }
LAB_0036f544:
  if (this->words_[3] == 0) {
    return -1;
  }
  iVar2 = FindLSBSet(this->words_[3]);
  return iVar2 + 0xc0;
}

Assistant:

int Bitmap256::FindNextSetBit(int c) const {
  DCHECK_GE(c, 0);
  DCHECK_LE(c, 255);

  // Check the word that contains the bit. Mask out any lower bits.
  int i = c / 64;
  uint64_t word = words_[i] & (~uint64_t{0} << (c % 64));
  if (word != 0)
    return (i * 64) + FindLSBSet(word);

  // Check any following words.
  i++;
  switch (i) {
    case 1:
      if (words_[1] != 0)
        return (1 * 64) + FindLSBSet(words_[1]);
      FALLTHROUGH_INTENDED;
    case 2:
      if (words_[2] != 0)
        return (2 * 64) + FindLSBSet(words_[2]);
      FALLTHROUGH_INTENDED;
    case 3:
      if (words_[3] != 0)
        return (3 * 64) + FindLSBSet(words_[3]);
      FALLTHROUGH_INTENDED;
    default:
      return -1;
  }
}